

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> * __thiscall
libtorrent::aux::session_impl::get_settings
          (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
           *__return_storage_ptr__,session_impl *this)

{
  pointer pcVar1;
  bool val;
  int val_00;
  string *psVar2;
  int i;
  int iVar3;
  session_settings *this_00;
  string local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_set_str_004e5260;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__[3].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = &this->m_settings;
  iVar3 = 0;
  do {
    psVar2 = session_settings::get_str_abi_cxx11_(this_00,iVar3);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + psVar2->_M_string_length);
    settings_pack::set_str((settings_pack *)__return_storage_ptr__,iVar3,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0xd);
  iVar3 = 0x4000;
  do {
    val_00 = session_settings::get_int(this_00,iVar3);
    settings_pack::set_int((settings_pack *)__return_storage_ptr__,iVar3,val_00);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x409f);
  iVar3 = 0x8000;
  do {
    val = session_settings::get_bool(this_00,iVar3);
    settings_pack::set_bool((settings_pack *)__return_storage_ptr__,iVar3,val);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x8054);
  return __return_storage_ptr__;
}

Assistant:

settings_pack session_impl::get_settings() const
	{
		settings_pack ret;
		// TODO: it would be nice to reserve() these vectors up front
		for (int i = settings_pack::string_type_base;
			i < settings_pack::max_string_setting_internal; ++i)
		{
			ret.set_str(i, m_settings.get_str(i));
		}
		for (int i = settings_pack::int_type_base;
			i < settings_pack::max_int_setting_internal; ++i)
		{
			ret.set_int(i, m_settings.get_int(i));
		}
		for (int i = settings_pack::bool_type_base;
			i < settings_pack::max_bool_setting_internal; ++i)
		{
			ret.set_bool(i, m_settings.get_bool(i));
		}
		return ret;
	}